

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O0

void __thiscall Lists<int_*>::append(Lists<int_*> *this,int *item)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> item_00;
  bool bVar1;
  ListNodes<int_*> *this_00;
  element_type *this_01;
  shared_ptr<ListNodes<int_*>_> local_60;
  undefined1 local_49;
  shared_ptr<ListNodes<int_*>_> local_48 [2];
  undefined1 local_28 [8];
  shared_ptr<ListNodes<int_*>_> node;
  int *item_local;
  Lists<int_*> *this_local;
  
  node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)item;
  std::shared_ptr<ListNodes<int_*>_>::shared_ptr((shared_ptr<ListNodes<int_*>_> *)local_28);
  this->theSize = this->theSize + 1;
  this_00 = (ListNodes<int_*> *)operator_new(0x18);
  item_00 = node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_49 = 1;
  std::shared_ptr<ListNodes<int_*>_>::shared_ptr(local_48,(nullptr_t)0x0);
  ListNodes<int_*>::ListNodes(this_00,(int *)item_00._M_pi,local_48);
  local_49 = 0;
  std::__shared_ptr<ListNodes<int*>,(__gnu_cxx::_Lock_policy)2>::reset<ListNodes<int*>>
            ((__shared_ptr<ListNodes<int*>,(__gnu_cxx::_Lock_policy)2> *)local_28,this_00);
  std::shared_ptr<ListNodes<int_*>_>::~shared_ptr(local_48);
  bVar1 = std::operator==(&this->theHead,(nullptr_t)0x0);
  if (bVar1) {
    std::shared_ptr<ListNodes<int_*>_>::operator=
              (&this->theHead,(shared_ptr<ListNodes<int_*>_> *)local_28);
    std::shared_ptr<ListNodes<int_*>_>::operator=
              (&this->theLast,(shared_ptr<ListNodes<int_*>_> *)local_28);
  }
  else {
    this_01 = std::__shared_ptr_access<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->theLast);
    std::shared_ptr<ListNodes<int_*>_>::shared_ptr
              (&local_60,(shared_ptr<ListNodes<int_*>_> *)local_28);
    ListNodes<int_*>::set_next(this_01,&local_60);
    std::shared_ptr<ListNodes<int_*>_>::~shared_ptr(&local_60);
    std::shared_ptr<ListNodes<int_*>_>::operator=
              (&this->theLast,(shared_ptr<ListNodes<int_*>_> *)local_28);
  }
  std::shared_ptr<ListNodes<int_*>_>::~shared_ptr((shared_ptr<ListNodes<int_*>_> *)local_28);
  return;
}

Assistant:

void Lists<T>::append(T item) {
    shared_ptr<ListNodes<T>> node;

    theSize++;
    node.reset(new ListNodes<T>(item, 0));

    if (theHead == nullptr) {
        theHead = node;
        theLast = node;
    } else {
        theLast->set_next(node);
        theLast = node;
    }
}